

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_0::genRandomBlendState
               (Random *rng,BlendState *blendState)

{
  undefined8 *puVar1;
  BlendFunc *pBVar2;
  undefined4 uVar3;
  Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *pEVar4;
  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
  *pEVar5;
  deBool dVar6;
  deUint32 dVar7;
  deBool dVar8;
  deBool dVar9;
  deBool dVar10;
  bool local_50;
  BlendFunc local_40;
  BlendFunc BStack_38;
  
  dVar6 = deRandom_getBool(&rng->m_rnd);
  if (dVar6 == 1) {
    dVar6 = deRandom_getBool(&rng->m_rnd);
    (blendState->enableBlend).field_1.m_data[0] = dVar6 == 1;
    (blendState->enableBlend).m_ptr = (bool *)&(blendState->enableBlend).field_1;
  }
  dVar6 = deRandom_getBool(&rng->m_rnd);
  if (dVar6 == 1) {
    dVar6 = deRandom_getBool(&rng->m_rnd);
    if (dVar6 != 1) {
      dVar7 = deRandom_getUint32(&rng->m_rnd);
      uVar3 = *(undefined4 *)(&DAT_01ccb860 + (ulong)(dVar7 % 5) * 4);
      dVar7 = deRandom_getUint32(&rng->m_rnd);
      local_40 = (BlendFunc)CONCAT44(*(undefined4 *)(&DAT_01ccb860 + (ulong)(dVar7 % 5) * 4),uVar3);
    }
    else {
      dVar7 = deRandom_getUint32(&rng->m_rnd);
      local_40.src = *(undefined4 *)(&DAT_01ccb860 + (ulong)(dVar7 % 5) * 4);
    }
    local_50 = dVar6 == 1;
    pEVar4 = (blendState->blendEq).m_ptr;
    if (pEVar4 != (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>
                   *)0x0) {
      pEVar4->m_isFirst = true;
      (pEVar4->field_1).m_first = (uint *)0x0;
    }
    (blendState->blendEq).field_1.m_data[0] = local_50;
    puVar1 = (undefined8 *)((long)&(blendState->blendEq).field_1 + 0x10);
    if (local_50) {
      *(deUint32 *)puVar1 = local_40.src;
    }
    else {
      *puVar1 = local_40;
    }
    *(undefined8 **)((long)&(blendState->blendEq).field_1 + 8) = puVar1;
    (blendState->blendEq).m_ptr =
         (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)
         &(blendState->blendEq).field_1;
  }
  dVar6 = deRandom_getBool(&rng->m_rnd);
  if (dVar6 == 1) {
    dVar6 = deRandom_getBool(&rng->m_rnd);
    if (dVar6 != 1) {
      local_40 = getRandomBlendFunc(rng);
      BStack_38 = getRandomBlendFunc(rng);
    }
    else {
      local_40 = getRandomBlendFunc(rng);
    }
    local_50 = dVar6 == 1;
    pEVar5 = (blendState->blendFunc).m_ptr;
    if (pEVar5 != (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
                   *)0x0) {
      pEVar5->m_isFirst = true;
      (pEVar5->field_1).m_first = (BlendFunc *)0x0;
    }
    (blendState->blendFunc).field_1.m_data[0] = local_50;
    pBVar2 = (BlendFunc *)((long)&(blendState->blendFunc).field_1 + 0x10);
    if (local_50) {
      *pBVar2 = local_40;
    }
    else {
      *pBVar2 = local_40;
      *(BlendFunc *)((long)&(blendState->blendFunc).field_1 + 0x18) = BStack_38;
    }
    *(BlendFunc **)((long)&(blendState->blendFunc).field_1 + 8) = pBVar2;
    (blendState->blendFunc).m_ptr =
         (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
          *)&(blendState->blendFunc).field_1;
  }
  dVar6 = deRandom_getBool(&rng->m_rnd);
  if (dVar6 == 1) {
    dVar6 = deRandom_getBool(&rng->m_rnd);
    dVar8 = deRandom_getBool(&rng->m_rnd);
    dVar9 = deRandom_getBool(&rng->m_rnd);
    dVar10 = deRandom_getBool(&rng->m_rnd);
    (blendState->colorMask).field_1.m_data[0] = dVar6 == 1;
    (blendState->colorMask).field_1.m_data[1] = dVar9 == 1;
    (blendState->colorMask).field_1.m_data[2] = dVar8 == 1;
    (blendState->colorMask).field_1.m_data[3] = dVar10 == 1;
    (blendState->colorMask).m_ptr = (Vector<bool,_4> *)&(blendState->colorMask).field_1;
  }
  return;
}

Assistant:

void genRandomBlendState (de::Random& rng, BlendState& blendState)
{
	if (rng.getBool())
		blendState.enableBlend = rng.getBool();

	if (rng.getBool())
	{
		if (rng.getBool())
			blendState.blendEq = getRandomBlendEq(rng);
		else
		{
			const BlendEq	rgb		= getRandomBlendEq(rng);
			const BlendEq	alpha	= getRandomBlendEq(rng);

			blendState.blendEq		= SeparateBlendEq(rgb, alpha);
		}
	}

	if (rng.getBool())
	{
		if (rng.getBool())
			blendState.blendFunc = getRandomBlendFunc(rng);
		else
		{
			const BlendFunc	rgb		= getRandomBlendFunc(rng);
			const BlendFunc	alpha	= getRandomBlendFunc(rng);

			blendState.blendFunc	= SeparateBlendFunc(rgb, alpha);
		}
	}

	if (rng.getBool())
	{
		const bool red		= rng.getBool();
		const bool green	= rng.getBool();
		const bool blue		= rng.getBool();
		const bool alpha	= rng.getBool();

		blendState.colorMask = BVec4(red, blue, green, alpha);
	}
}